

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS
ref_metric_opt_goal(REF_DBL *metric,REF_GRID ref_grid,REF_INT nequations,REF_DBL *solution,
                   REF_RECON_RECONSTRUCTION reconstruction,REF_INT p_norm,REF_DBL gradation,
                   REF_DBL target_complexity)

{
  size_t __size;
  undefined8 *puVar1;
  REF_NODE pRVar2;
  REF_GLOB *pRVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  long *plVar7;
  REF_DBL *pRVar8;
  REF_DBL *grad;
  REF_DBL *scalar;
  REF_DBL *hessian;
  REF_DBL *pRVar9;
  ulong uVar10;
  REF_DBL *pRVar11;
  undefined8 uVar12;
  ulong uVar13;
  REF_DBL *pRVar14;
  ulong uVar15;
  long lVar16;
  char *pcVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  double dVar21;
  REF_DBL *local_70;
  
  pRVar2 = ref_grid->node;
  uVar6 = pRVar2->max;
  uVar20 = (ulong)(int)uVar6;
  if (0 < (long)uVar20) {
    plVar7 = pRVar2->global;
    uVar13 = 0;
    do {
      if (-1 < *plVar7) {
        uVar15 = uVar13 & 0x7fffffff0;
        puVar1 = (undefined8 *)((long)metric + uVar15 + 0x20);
        *puVar1 = 0;
        puVar1[1] = 0;
        puVar1 = (undefined8 *)((long)metric + uVar15 + 0x10);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)metric + uVar15) = 0;
        ((undefined8 *)((long)metric + uVar15))[1] = 0;
      }
      uVar13 = uVar13 + 0x30;
      plVar7 = plVar7 + 1;
    } while (uVar20 * 0x30 != uVar13);
  }
  if (0 < nequations) {
    uVar13 = (ulong)(uint)nequations;
    local_70 = solution + uVar13;
    uVar15 = 0;
    do {
      iVar19 = (int)uVar20;
      if (iVar19 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xa51,"ref_metric_opt_goal","malloc lam of REF_DBL negative");
        return 1;
      }
      __size = (uVar20 & 0xffffffff) * 8;
      pRVar8 = (REF_DBL *)malloc(__size);
      if (pRVar8 == (REF_DBL *)0x0) {
        pcVar17 = "malloc lam of REF_DBL NULL";
        uVar12 = 0xa51;
LAB_001bc51f:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar12,"ref_metric_opt_goal",pcVar17);
        return 2;
      }
      if (iVar19 != 0) {
        memset(pRVar8,0,__size);
      }
      grad = (REF_DBL *)malloc((ulong)(uint)(iVar19 * 3) * 8);
      if (grad == (REF_DBL *)0x0) {
        pcVar17 = "malloc grad_lam of REF_DBL NULL";
        uVar12 = 0xa52;
        goto LAB_001bc51f;
      }
      if (iVar19 == 0) {
        scalar = (REF_DBL *)malloc(__size);
      }
      else {
        memset(grad,0,(ulong)(uint)(iVar19 * 3) << 3);
        scalar = (REF_DBL *)calloc(1,__size);
      }
      if (scalar == (REF_DBL *)0x0) {
        pcVar17 = "malloc flux of REF_DBL NULL";
        uVar12 = 0xa53;
        goto LAB_001bc51f;
      }
      hessian = (REF_DBL *)malloc((ulong)(uint)(iVar19 * 6) * 8);
      if (hessian == (REF_DBL *)0x0) {
        pcVar17 = "malloc hess_flux of REF_DBL NULL";
        uVar12 = 0xa54;
        goto LAB_001bc51f;
      }
      if (iVar19 != 0) {
        memset(hessian,0,(ulong)(uint)(iVar19 * 6) << 3);
        pRVar3 = pRVar2->global;
        uVar10 = 0;
        pRVar9 = solution;
        do {
          if (-1 < pRVar3[uVar10]) {
            pRVar8[uVar10] = *pRVar9;
          }
          uVar10 = uVar10 + 1;
          pRVar9 = pRVar9 + (uint)(nequations * 4);
        } while ((uVar20 & 0xffffffff) != uVar10);
      }
      uVar6 = ref_recon_gradient(ref_grid,pRVar8,grad,reconstruction);
      if (uVar6 != 0) {
        pcVar17 = "grad_lam";
        uVar12 = 0xa59;
        goto LAB_001bc3c5;
      }
      uVar20 = (ulong)(uint)pRVar2->max;
      lVar18 = 0;
      pRVar9 = local_70;
      do {
        if (0 < (int)uVar20) {
          pRVar3 = pRVar2->global;
          uVar10 = 0;
          pRVar11 = pRVar9;
          do {
            if (-1 < pRVar3[uVar10]) {
              scalar[uVar10] = *pRVar11;
            }
            uVar10 = uVar10 + 1;
            pRVar11 = pRVar11 + (uint)(nequations * 4);
          } while ((uVar20 & 0xffffffff) != uVar10);
        }
        uVar6 = ref_recon_hessian(ref_grid,scalar,hessian,reconstruction);
        if (uVar6 != 0) {
          pcVar17 = "hess";
          uVar12 = 0xa5f;
          goto LAB_001bc3c5;
        }
        uVar6 = pRVar2->max;
        uVar20 = (ulong)(int)uVar6;
        if (0 < (long)uVar20) {
          pRVar3 = pRVar2->global;
          uVar10 = 0;
          pRVar11 = hessian;
          pRVar14 = metric;
          do {
            if (-1 < pRVar3[uVar10]) {
              dVar21 = grad[lVar18 + uVar10 * 3];
              if (dVar21 <= -dVar21) {
                dVar21 = -dVar21;
              }
              lVar16 = 0;
              do {
                dVar4 = (pRVar11 + lVar16)[1];
                dVar5 = (pRVar14 + lVar16)[1];
                pRVar14[lVar16] = pRVar14[lVar16] + pRVar11[lVar16] * dVar21;
                (pRVar14 + lVar16)[1] = dVar5 + dVar4 * dVar21;
                lVar16 = lVar16 + 2;
              } while (lVar16 != 6);
            }
            uVar10 = uVar10 + 1;
            pRVar14 = pRVar14 + 6;
            pRVar11 = pRVar11 + 6;
          } while (uVar10 != uVar20);
        }
        lVar18 = lVar18 + 1;
        pRVar9 = pRVar9 + uVar13;
      } while (lVar18 != 3);
      free(hessian);
      free(scalar);
      free(grad);
      free(pRVar8);
      uVar15 = uVar15 + 1;
      solution = solution + 1;
      local_70 = local_70 + 1;
    } while (uVar15 != uVar13);
  }
  if ((ref_grid->twod != 0) && (0 < (int)uVar6)) {
    pRVar3 = pRVar2->global;
    pRVar8 = metric + 4;
    uVar20 = 0;
    do {
      if (-1 < pRVar3[uVar20]) {
        pRVar8[-2] = 0.0;
        *pRVar8 = 0.0;
        pRVar8[1] = 1.0;
      }
      uVar20 = uVar20 + 1;
      pRVar8 = pRVar8 + 6;
    } while (uVar6 != uVar20);
  }
  uVar6 = ref_recon_roundoff_limit(metric,ref_grid);
  if (uVar6 == 0) {
    uVar6 = ref_metric_local_scale(metric,ref_grid,p_norm);
    if (uVar6 == 0) {
      uVar6 = ref_metric_gradation_at_complexity(metric,ref_grid,gradation,target_complexity);
      if (uVar6 == 0) {
        return 0;
      }
      pcVar17 = "gradation at complexity";
      uVar12 = 0xa7a;
    }
    else {
      pcVar17 = "local scale lp norm";
      uVar12 = 0xa76;
    }
  }
  else {
    pcVar17 = "floor metric eigenvalues based on grid size and solution jitter";
    uVar12 = 0xa74;
  }
LAB_001bc3c5:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar12,
         "ref_metric_opt_goal",(ulong)uVar6,pcVar17);
  return uVar6;
}

Assistant:

REF_FCN REF_STATUS ref_metric_opt_goal(REF_DBL *metric, REF_GRID ref_grid,
                                       REF_INT nequations, REF_DBL *solution,
                                       REF_RECON_RECONSTRUCTION reconstruction,
                                       REF_INT p_norm, REF_DBL gradation,
                                       REF_DBL target_complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT i, node;
  REF_INT ldim;
  REF_INT var, dir;

  ldim = 4 * nequations;

  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 6; i++) metric[i + 6 * node] = 0.0;
  }

  for (var = 0; var < nequations; var++) {
    REF_DBL *lam, *grad_lam, *flux, *hess_flux;
    ref_malloc_init(lam, ref_node_max(ref_node), REF_DBL, 0.0);
    ref_malloc_init(grad_lam, 3 * ref_node_max(ref_node), REF_DBL, 0.0);
    ref_malloc_init(flux, ref_node_max(ref_node), REF_DBL, 0.0);
    ref_malloc_init(hess_flux, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
    each_ref_node_valid_node(ref_node, node) {
      lam[node] = solution[var + ldim * node];
    }
    RSS(ref_recon_gradient(ref_grid, lam, grad_lam, reconstruction),
        "grad_lam");

    for (dir = 0; dir < 3; dir++) {
      each_ref_node_valid_node(ref_node, node) {
        flux[node] = solution[var + nequations * (1 + dir) + ldim * node];
      }
      RSS(ref_recon_hessian(ref_grid, flux, hess_flux, reconstruction), "hess");
      each_ref_node_valid_node(ref_node, node) {
        for (i = 0; i < 6; i++)
          metric[i + 6 * node] +=
              ABS(grad_lam[dir + 3 * node]) * hess_flux[i + 6 * node];
      }
    }
    ref_free(hess_flux);
    ref_free(flux);
    ref_free(grad_lam);
    ref_free(lam);
  }
  if (ref_grid_twod(ref_grid)) {
    each_ref_node_valid_node(ref_node, node) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  RSS(ref_recon_roundoff_limit(metric, ref_grid),
      "floor metric eigenvalues based on grid size and solution jitter");

  RSS(ref_metric_local_scale(metric, ref_grid, p_norm), "local scale lp norm");

  RSS(ref_metric_gradation_at_complexity(metric, ref_grid, gradation,
                                         target_complexity),
      "gradation at complexity");

  return REF_SUCCESS;
}